

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::FreeZeroObjVariablePS::FreeZeroObjVariablePS
          (FreeZeroObjVariablePS *this,FreeZeroObjVariablePS *old)

{
  long in_RSI;
  Array<soplex::DSVectorBase<double>_> *in_RDI;
  PostStep *in_stack_ffffffffffffffb8;
  PostStep *in_stack_ffffffffffffffc0;
  Array<soplex::DSVectorBase<double>_> *old_00;
  
  PostStep::PostStep(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (in_RDI->data).
  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__FreeZeroObjVariablePS_008978f8;
  *(undefined4 *)
   &in_RDI[1].data.
    super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(undefined4 *)(in_RSI + 0x28);
  *(undefined4 *)
   ((long)&in_RDI[1].data.
           super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = *(undefined4 *)(in_RSI + 0x2c);
  *(undefined4 *)
   &in_RDI[2].data.
    super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(undefined4 *)(in_RSI + 0x30);
  in_RDI[2].data.
  super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = *(pointer *)(in_RSI + 0x38);
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffffc0,
             (DSVectorBase<double> *)in_stack_ffffffffffffffb8);
  old_00 = in_RDI + 4;
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffffc0,
             (DSVectorBase<double> *)in_stack_ffffffffffffffb8);
  DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)
             &in_RDI[5].data.
              super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
             (DSVectorBase<double> *)in_stack_ffffffffffffffb8);
  Array<soplex::DSVectorBase<double>_>::Array(in_RDI,old_00);
  *(byte *)&in_RDI[7].data.
            super__Vector_base<soplex::DSVectorBase<double>,_std::allocator<soplex::DSVectorBase<double>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = *(byte *)(in_RSI + 0xb8) & 1;
  return;
}

Assistant:

FreeZeroObjVariablePS(const FreeZeroObjVariablePS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_old_j(old.m_old_j)
         , m_old_i(old.m_old_i)
         , m_bnd(old.m_bnd)
         , m_col(old.m_col)
         , m_lRhs(old.m_lRhs)
         , m_rowObj(old.m_rowObj)
         , m_rows(old.m_rows)
         , m_loFree(old.m_loFree)
      {}